

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  Type_Conversions_State *t_conversions;
  Boxed_Value *pBVar1;
  Type_Conversions *pTVar2;
  Dispatch_Engine *pDVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 funcs;
  bool bVar5;
  int iVar6;
  Dispatch_State *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  string *psVar8;
  Boxed_Value BVar9;
  string_view t_name;
  string_view t_name_00;
  string_view t_name_01;
  string_view t_name_02;
  Boxed_Value range_obj;
  Boxed_Value range_expression_result;
  anon_class_24_3_0ad2d99a do_loop;
  Function_Params local_118;
  Boxed_Value local_108;
  undefined1 local_f8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [16];
  Boxed_Value local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Boxed_Value local_88;
  undefined1 local_78 [32];
  _Base_ptr local_58;
  dispatch local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
  psVar8 = (string *)((pTVar2->m_mutex)._M_impl._M_rwlock.__align + 0x10);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_b8,
             *(Dispatch_State **)((long)&(pTVar2->m_mutex)._M_impl._M_rwlock + 8));
  local_98._8_8_ = psVar8;
  local_78._0_8_ = psVar8;
  local_78._16_8_ = t_ss;
  bVar5 = Type_Info::bare_equal_type_info
                    ((Type_Info *)local_b8._0_8_,
                     (type_info *)
                     &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                      typeinfo);
  if (bVar5) {
    boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&>
              ((Boxed_Value *)local_b8,(Type_Conversions_State *)0x0);
    BVar9 = const::{lambda(auto:1_const&)#1}::operator()
                      ((_lambda_auto_1_const___1_ *)this,
                       (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                       local_78);
    _Var7._M_pi = BVar9.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    bVar5 = Type_Info::bare_equal_type_info
                      ((Type_Info *)local_b8._0_8_,
                       (type_info *)
                       &std::
                        map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                        ::typeinfo);
    if (bVar5) {
      boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                ((Boxed_Value *)local_b8,(Type_Conversions_State *)0x0);
      BVar9 = const::{lambda(auto:1_const&)#1}::operator()
                        ((_lambda_auto_1_const___1_ *)this,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                          *)local_78);
      _Var7._M_pi = BVar9.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    else {
      local_118.m_begin = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"range","");
      pDVar3 = (Dispatch_Engine *)t_ss[3].m_stack_holder._M_data;
      t_name._M_str = (char *)local_118.m_begin;
      t_name._M_len = (size_t)local_118.m_end;
      chaiscript::detail::Dispatch_Engine::get_function
                ((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                  *)local_f8,(in_RDX->m_engine)._M_data,t_name,(size_t)pDVar3);
      funcs = local_f8._8_8_;
      if ((Dispatch_Engine *)local_f8._0_8_ != pDVar3) {
        LOCK();
        t_ss[3].m_stack_holder._M_data = (Stack_Holder *)local_f8._0_8_;
        UNLOCK();
      }
      local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_;
      if (local_118.m_begin != &local_108) {
        operator_delete(local_118.m_begin,
                        (ulong)((long)&((local_108.m_data.
                                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_type_info).m_type_info + 1));
      }
      local_118.m_begin = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"empty","");
      pDVar3 = (Dispatch_Engine *)t_ss[3].m_conversions.m_conversions._M_data;
      t_name_00._M_str = (char *)local_118.m_begin;
      t_name_00._M_len = (size_t)local_118.m_end;
      chaiscript::detail::Dispatch_Engine::get_function
                ((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                  *)local_f8,(in_RDX->m_engine)._M_data,t_name_00,(size_t)pDVar3);
      if ((Dispatch_Engine *)local_f8._0_8_ != pDVar3) {
        LOCK();
        t_ss[3].m_conversions.m_conversions._M_data = (Type_Conversions *)local_f8._0_8_;
        UNLOCK();
      }
      local_98._M_allocated_capacity = local_f8._8_8_;
      local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_;
      if (local_118.m_begin != &local_108) {
        operator_delete(local_118.m_begin,
                        (ulong)((long)&((local_108.m_data.
                                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_type_info).m_type_info + 1));
      }
      local_118.m_begin = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"front","");
      pDVar3 = (Dispatch_Engine *)t_ss[3].m_conversions.m_saves._M_data;
      t_name_01._M_str = (char *)local_118.m_begin;
      t_name_01._M_len = (size_t)local_118.m_end;
      chaiscript::detail::Dispatch_Engine::get_function
                ((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                  *)local_f8,(in_RDX->m_engine)._M_data,t_name_01,(size_t)pDVar3);
      if ((Dispatch_Engine *)local_f8._0_8_ != pDVar3) {
        LOCK();
        t_ss[3].m_conversions.m_saves._M_data = (Conversion_Saves *)local_f8._0_8_;
        UNLOCK();
      }
      local_a8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
      local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_;
      if (local_118.m_begin != &local_108) {
        operator_delete(local_118.m_begin,
                        (ulong)((long)&((local_108.m_data.
                                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_type_info).m_type_info + 1));
      }
      local_118.m_begin = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"pop_front","");
      pDVar3 = t_ss[4].m_engine._M_data;
      t_name_02._M_str = (char *)local_118.m_begin;
      t_name_02._M_len = (size_t)local_118.m_end;
      chaiscript::detail::Dispatch_Engine::get_function
                ((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                  *)local_f8,(in_RDX->m_engine)._M_data,t_name_02,(size_t)pDVar3);
      if ((Dispatch_Engine *)local_f8._0_8_ != pDVar3) {
        LOCK();
        t_ss[4].m_engine._M_data = (Dispatch_Engine *)local_f8._0_8_;
        UNLOCK();
      }
      local_a8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_f8._8_8_;
      local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_;
      local_d8 = this;
      if (local_118.m_begin != &local_108) {
        operator_delete(local_118.m_begin,
                        (ulong)((long)&((local_108.m_data.
                                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_type_info).m_type_info + 1));
      }
      local_118.m_end = &local_a8;
      t_conversions = &in_RDX->m_conversions;
      local_118.m_begin = (Boxed_Value *)local_b8;
      dispatch::
      dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                ((dispatch *)local_f8,
                 (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  *)funcs,&local_118,t_conversions);
      pBVar1 = (Boxed_Value *)(local_f8 + 0x10);
      while( true ) {
        local_118.m_begin = (Boxed_Value *)local_f8;
        local_118.m_end = pBVar1;
        dispatch::
        dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  ((dispatch *)(local_78 + 0x18),
                   (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)local_98._M_allocated_capacity,&local_118,t_conversions);
        bVar5 = boxed_cast<bool>((Boxed_Value *)(local_78 + 0x18),(Type_Conversions_State *)0x0);
        _Var7._M_pi = extraout_RDX;
        if (local_58 != (_Base_ptr)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
          _Var7._M_pi = extraout_RDX_00;
        }
        if (bVar5) break;
        chaiscript::detail::Dispatch_Engine::new_scope((in_RDX->m_stack_holder)._M_data);
        local_118.m_begin = (Boxed_Value *)local_f8;
        local_118.m_end = pBVar1;
        dispatch::
        dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  ((dispatch *)&local_88,
                   (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)local_a8.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,&local_118,t_conversions);
        chaiscript::detail::Dispatch_State::add_get_object
                  (in_RDX,(string *)local_98._8_8_,&local_88);
        if ((File_Position)
            local_88.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (File_Position)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_40,
                   *(Dispatch_State **)
                    ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                            _M_rwlock + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
        }
        local_118.m_begin = (Boxed_Value *)local_f8;
        local_118.m_end = pBVar1;
        dispatch::
        dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  (local_50,(vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                             *)local_a8.m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_118,t_conversions);
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
        chaiscript::detail::Dispatch_Engine::pop_scope((in_RDX->m_stack_holder)._M_data);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        _Var7._M_pi = extraout_RDX_01;
      }
      this = local_d8;
      if (void_var()::v == '\0') {
        iVar6 = __cxa_guard_acquire(&void_var()::v);
        _Var7._M_pi = extraout_RDX_07;
        if (iVar6 != 0) {
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
          (void_var::v.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count = 1;
          (void_var::v.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_weak_count = 1;
          (void_var::v.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0059e870;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (void_var::v.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 1);
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&void::typeinfo;
          *(undefined **)
           &void_var::v.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[1]._M_use_count = &void::typeinfo;
          *(undefined4 *)
           &void_var::v.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[2]._vptr__Sp_counted_base = 8;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._M_use_count = 0;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._M_weak_count = 0;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._M_use_count = 0;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._M_weak_count = 0;
          void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          *(undefined2 *)
           &void_var::v.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[4]._M_use_count = 0;
          __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
          __cxa_guard_release(&void_var()::v);
          _Var7._M_pi = extraout_RDX_08;
          this = local_d8;
        }
      }
      (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.
      _vptr_AST_Node =
           (_func_int **)
           void_var::v.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var4 = void_var::v.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node.
        identifier = void_var::v.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
        }
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
        _Var7._M_pi = extraout_RDX_02;
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
        _Var7._M_pi = extraout_RDX_03;
      }
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
        _Var7._M_pi = extraout_RDX_04;
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
        _Var7._M_pi = extraout_RDX_05;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    _Var7._M_pi = extraout_RDX_06;
  }
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const auto get_function = [&t_ss](const std::string &t_name, auto &t_hint) {
          uint_fast32_t hint = t_hint;
          auto [funs_loc, funs] = t_ss->get_function(t_name, hint);
          if (funs_loc != hint) {
            t_hint = uint_fast32_t(funs_loc);
          }
          return std::move(funs);
        };

        const auto call_function = [&t_ss](const auto &t_funcs, const Boxed_Value &t_param) {
          return dispatch::dispatch(*t_funcs, Function_Params{t_param}, t_ss.conversions());
        };

        const std::string &loop_var_name = this->children[0]->text;
        Boxed_Value range_expression_result = this->children[1]->eval(t_ss);

        const auto do_loop = [&loop_var_name, &t_ss, this](const auto &ranged_thing) {
          try {
            for (auto &&loop_var : ranged_thing) {
              // This scope push and pop might not be the best thing for perf
              // but we know it's 100% correct
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              /// to-do make this if-constexpr with C++17 branch
              if (!std::is_same<std::decay_t<decltype(loop_var)>, Boxed_Value>::value) {
                t_ss.add_get_object(loop_var_name, Boxed_Value(std::ref(loop_var)));
              } else {
                t_ss.add_get_object(loop_var_name, Boxed_Value(loop_var));
              }
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
              }
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        };

        if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::vector<Boxed_Value>))) {
          return do_loop(boxed_cast<const std::vector<Boxed_Value> &>(range_expression_result));
        } else if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::map<std::string, Boxed_Value>))) {
          return do_loop(boxed_cast<const std::map<std::string, Boxed_Value> &>(range_expression_result));
        } else {
          const auto range_funcs = get_function("range", m_range_loc);
          const auto empty_funcs = get_function("empty", m_empty_loc);
          const auto front_funcs = get_function("front", m_front_loc);
          const auto pop_front_funcs = get_function("pop_front", m_pop_front_loc);

          try {
            const auto range_obj = call_function(range_funcs, range_expression_result);
            while (!boxed_cast<bool>(call_function(empty_funcs, range_obj))) {
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              t_ss.add_get_object(loop_var_name, call_function(front_funcs, range_obj));
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // continue statement hit
              }
              call_function(pop_front_funcs, range_obj);
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        }
      }